

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

StringList * __thiscall
Rml::DataViewFor::GetVariableNameList_abi_cxx11_
          (StringList *__return_storage_ptr__,DataViewFor *this)

{
  pointer pDVar1;
  _Alloc_hider _Var2;
  code *pcVar3;
  bool bVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->container_address).
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->container_address).
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = Assert("RMLUI_ASSERT(!container_address.empty())",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                   ,0x23a);
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  pDVar1 = (this->container_address).
           super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
           .super__Vector_impl_data._M_start;
  _Var2._M_p = (pDVar1->name)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,_Var2._M_p,_Var2._M_p + (pDVar1->name)._M_string_length);
  __l._M_len = 1;
  __l._M_array = &local_38;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__return_storage_ptr__,__l,&local_39);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

StringList DataViewFor::GetVariableNameList() const
{
	RMLUI_ASSERT(!container_address.empty());
	return StringList{container_address.front().name};
}